

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void cleanup_room(void)

{
  room_template *prVar1;
  room_template *next;
  room_template *t;
  
  next = room_templates;
  while (next != (room_template *)0x0) {
    prVar1 = next->next;
    mem_free(next->name);
    mem_free(next->text);
    mem_free(next);
    next = prVar1;
  }
  return;
}

Assistant:

static void cleanup_room(void)
{
	struct room_template *t, *next;
	for (t = room_templates; t; t = next) {
		next = t->next;
		mem_free(t->name);
		mem_free(t->text);
		mem_free(t);
	}
}